

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_eh.h
# Opt level: O0

uint64_t read_leb128(dw_eh_ptr_t *data,int *b)

{
  byte bVar1;
  uint local_24;
  uchar digit;
  uint64_t uStack_20;
  uint bit;
  uint64_t uleb;
  int *b_local;
  dw_eh_ptr_t *data_local;
  
  uStack_20 = 0;
  local_24 = 0;
  do {
    if (0x3f < local_24) {
      __assert_fail("bit < sizeof(uint64_t) * 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/libcxxrt[P]libcxxrt/src/dwarf_eh.h"
                    ,0xa7,"uint64_t read_leb128(dw_eh_ptr_t *, int *)");
    }
    bVar1 = **data;
    uStack_20 = (long)(int)((uint)(bVar1 & 0x7f) << ((byte)local_24 & 0x1f)) + uStack_20;
    local_24 = local_24 + 7;
    *data = *data + 1;
  } while ((*data)[-1] != (bVar1 & 0x7f));
  *b = local_24;
  return uStack_20;
}

Assistant:

static uint64_t read_leb128(dw_eh_ptr_t *data, int *b)
{
	uint64_t uleb = 0;
	unsigned int bit = 0;
	unsigned char digit = 0;
	// We have to read at least one octet, and keep reading until we get to one
	// with the high bit unset
	do
	{
		// This check is a bit too strict - we should also check the highest
		// bit of the digit.
		assert(bit < sizeof(uint64_t) * 8);
		// Get the base 128 digit 
		digit = (**data) & 0x7f;
		// Add it to the current value
		uleb += digit << bit;
		// Increase the shift value
		bit += 7;
		// Proceed to the next octet
		(*data)++;
		// Terminate when we reach a value that does not have the high bit set
		// (i.e. which was not modified when we mask it with 0x7f)
	} while ((*(*data - 1)) != digit);
	*b = bit;

	return uleb;
}